

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

string * __thiscall
re2::RegexpStatus::Text_abi_cxx11_(string *__return_storage_ptr__,RegexpStatus *this)

{
  ulong uVar1;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if ((this->error_arg_).size_ == 0) {
    uVar1 = 1;
    if (this->code_ < (kRegexpBadUTF8|kRegexpBadEscape)) {
      uVar1 = (ulong)this->code_;
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,*(char **)(kErrorStrings + uVar1 * 8),
               (allocator *)local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar1 = 1;
    if (this->code_ < (kRegexpBadUTF8|kRegexpBadEscape)) {
      uVar1 = (ulong)this->code_;
    }
    std::__cxx11::string::string((string *)local_38,*(char **)(kErrorStrings + uVar1 * 8),&local_39)
    ;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(this->error_arg_).data_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RegexpStatus::Text() const {
  if (error_arg_.empty())
    return CodeText(code_);
  std::string s;
  s.append(CodeText(code_));
  s.append(": ");
  s.append(error_arg_.data(), error_arg_.size());
  return s;
}